

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O3

int ncnn::compute_coord(int sx,int w,int padding_mode,int align_corner)

{
  int iVar1;
  
  if (padding_mode == 3) {
    if (align_corner != 0) {
      return (int)((float)(w + -1) - ABS(ABS((float)sx) - (float)(w + -1)));
    }
    sx = (int)(((float)w + -0.5) - ABS(ABS((float)sx + 0.5) - (float)w));
  }
  else if (padding_mode != 2) {
    return sx;
  }
  iVar1 = 0;
  if (0 < sx) {
    iVar1 = sx;
  }
  if (w + -1 <= iVar1) {
    iVar1 = w + -1;
  }
  return (int)(float)iVar1;
}

Assistant:

static int compute_coord(int sx, int w, int padding_mode, int align_corner)
{
    if (padding_mode == 2) // border
    {
        sx = border_coord(sx, w - 1);
    }
    else if (padding_mode == 3) // reflection
    {
        if (align_corner)
        {
            sx = reflect_coord(sx, w - 1);
        }
        else
        {
            sx = static_cast<int>(reflect_coord(sx + 0.5f, w) - 0.5f);
            sx = border_coord(sx, w - 1);
        }
    }

    return sx;
}